

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

void Bbl_ManDumpBlif(Bbl_Man_t *p,char *pFileName)

{
  uint uVar1;
  FILE *__s;
  ulong uVar2;
  ulong uVar3;
  char *__format;
  uint *puVar4;
  uint *puVar5;
  
  __s = fopen(pFileName,"w");
  fwrite("# Test file written by Bbl_ManDumpBlif() in ABC.\n",0x31,1,__s);
  fprintf(__s,".model %s\n",p->pName->pArray);
  puVar5 = (uint *)p->pObjs->pArray;
  if (puVar5 != (uint *)0x0) {
    do {
      if ((puVar5[2] & 1) == 0) {
        if ((puVar5[2] & 2) == 0) {
          fwrite(".names",6,1,__s);
          if (puVar5[2] < 0x10) goto LAB_00449e96;
          uVar1 = puVar5[3];
LAB_00449ee8:
          puVar4 = (uint *)((long)puVar5 - (long)(int)uVar1);
          do {
            if (puVar4 == (uint *)0x0) {
              fprintf(__s," %d\n",(ulong)*puVar5);
              fputs(p->pFncs->pArray + (long)(int)puVar5[1] + 4,__s);
              goto LAB_00449f23;
            }
            fprintf(__s," %d",(ulong)*puVar4);
            uVar1 = puVar5[2] >> 4;
            uVar3 = 0;
            if (0xf < puVar5[2]) {
              uVar2 = 0;
              do {
                uVar3 = uVar2;
                if ((uint *)((long)puVar5 - (long)(int)puVar5[uVar2 + 3]) == puVar4) break;
                uVar2 = uVar2 + 1;
                uVar3 = (ulong)uVar1;
              } while (uVar1 != uVar2);
            }
            if ((int)uVar3 < (int)(uVar1 - 1)) goto code_r0x00449ee1;
LAB_00449e96:
            puVar4 = (uint *)0x0;
          } while( true );
        }
        uVar1 = *puVar5;
        __format = ".outputs %d\n";
      }
      else {
        uVar1 = *puVar5;
        __format = ".inputs %d\n";
      }
      fprintf(__s,__format,(ulong)uVar1);
LAB_00449f23:
      puVar5 = puVar5 + (ulong)(puVar5[2] >> 4) + 3;
    } while (puVar5 < p->pObjs->pArray + p->pObjs->nSize);
  }
  puVar5 = (uint *)p->pObjs->pArray;
  if (puVar5 != (uint *)0x0) {
    do {
      if ((puVar5[2] & 2) != 0) {
        fwrite(".names",6,1,__s);
        if (puVar5[2] < 0x10) goto LAB_00449f96;
        uVar1 = puVar5[3];
LAB_00449fec:
        puVar4 = (uint *)((long)puVar5 - (long)(int)uVar1);
        do {
          if (puVar4 == (uint *)0x0) {
            fprintf(__s," %d\n",(ulong)*puVar5);
            fwrite("1 1\n",4,1,__s);
            break;
          }
          fprintf(__s," %d",(ulong)*puVar4);
          uVar1 = puVar5[2] >> 4;
          uVar3 = 0;
          if (0xf < puVar5[2]) {
            uVar2 = 0;
            do {
              uVar3 = uVar2;
              if ((uint *)((long)puVar5 - (long)(int)puVar5[uVar2 + 3]) == puVar4) break;
              uVar2 = uVar2 + 1;
              uVar3 = (ulong)uVar1;
            } while (uVar1 != uVar2);
          }
          if ((int)uVar3 < (int)(uVar1 - 1)) goto code_r0x00449fe4;
LAB_00449f96:
          puVar4 = (uint *)0x0;
        } while( true );
      }
      puVar5 = puVar5 + (ulong)(puVar5[2] >> 4) + 3;
    } while (puVar5 < p->pObjs->pArray + p->pObjs->nSize);
  }
  fwrite(".end\n",5,1,__s);
  fclose(__s);
  return;
code_r0x00449ee1:
  uVar1 = puVar5[(uVar3 & 0xffffffff) + 4];
  goto LAB_00449ee8;
code_r0x00449fe4:
  uVar1 = puVar5[(uVar3 & 0xffffffff) + 4];
  goto LAB_00449fec;
}

Assistant:

void Bbl_ManDumpBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Bbl_Obj_t * pObj, * pFanin;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# Test file written by Bbl_ManDumpBlif() in ABC.\n" );
    fprintf( pFile, ".model %s\n", Bbl_ManName(p) );
    // write objects
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            fprintf( pFile, ".inputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsOutput(pObj) )
            fprintf( pFile, ".outputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsLut(pObj) )
        {
            fprintf( pFile, ".names" );
            Bbl_ObjForEachFanin( pObj, pFanin )
                fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
            fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
            fprintf( pFile, "%s", Bbl_ObjSop(p, pObj) );
        }
        else assert( 0 );
    }
    // write output drivers
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        fprintf( pFile, ".names" );
        Bbl_ObjForEachFanin( pObj, pFanin )
            fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
        fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
        fprintf( pFile, "1 1\n" );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}